

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowIcon(GLFWwindow *handle,int count,GLFWimage *images)

{
  _GLFWwindow *window;
  GLFWimage *images_local;
  int count_local;
  GLFWwindow *handle_local;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/glfw-3.2.1/src/window.c"
                  ,0x1ba,"void glfwSetWindowIcon(GLFWwindow *, int, const GLFWimage *)");
  }
  if (-1 < count) {
    if ((count != 0) && (images == (GLFWimage *)0x0)) {
      __assert_fail("count == 0 || images != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/glfw-3.2.1/src/window.c"
                    ,0x1bc,"void glfwSetWindowIcon(GLFWwindow *, int, const GLFWimage *)");
    }
    if (_glfwInitialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      _glfwPlatformSetWindowIcon((_GLFWwindow *)handle,count,images);
    }
    return;
  }
  __assert_fail("count >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/glfw-3.2.1/src/window.c"
                ,0x1bb,"void glfwSetWindowIcon(GLFWwindow *, int, const GLFWimage *)");
}

Assistant:

GLFWAPI void glfwSetWindowIcon(GLFWwindow* handle,
                               int count, const GLFWimage* images)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);
    assert(count >= 0);
    assert(count == 0 || images != NULL);

    _GLFW_REQUIRE_INIT();
    _glfwPlatformSetWindowIcon(window, count, images);
}